

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_socket(Curl_easy *data,Curl_addrinfo *ai,Curl_sockaddr_ex *addr,curl_socket_t *sockfd)

{
  uint uVar1;
  connectdata *pcVar2;
  int iVar3;
  curl_socket_t cVar4;
  int iVar5;
  Curl_sockaddr_ex *pCVar6;
  int iVar7;
  Curl_sockaddr_ex *pCVar8;
  int val;
  Curl_sockaddr_ex dummy;
  undefined4 local_cc;
  connectdata *local_c8;
  Curl_sockaddr_ex local_c0;
  
  local_c8 = data->conn;
  pCVar8 = addr;
  if (addr == (Curl_sockaddr_ex *)0x0) {
    pCVar8 = &local_c0;
  }
  iVar5 = ai->ai_family;
  pCVar8->family = iVar5;
  iVar3 = 1;
  if (local_c8->transport == '\x03') {
    iVar7 = 6;
  }
  else if (local_c8->transport == '\x06') {
    iVar7 = 0;
  }
  else {
    iVar7 = 0x11;
    iVar3 = 2;
  }
  pCVar8->socktype = iVar3;
  pCVar8->protocol = iVar7;
  pCVar6 = addr;
  if (addr == (Curl_sockaddr_ex *)0x0) {
    pCVar6 = &local_c0;
  }
  uVar1 = 0x80;
  if (ai->ai_addrlen < 0x80) {
    uVar1 = ai->ai_addrlen;
  }
  pCVar6->addrlen = uVar1;
  memcpy(&pCVar6->_sa_ex_u,ai->ai_addr,(ulong)uVar1);
  if ((data->set).fopensocket == (curl_opensocket_callback)0x0) {
    pCVar6 = addr;
    if (addr == (Curl_sockaddr_ex *)0x0) {
      pCVar6 = &local_c0;
    }
    iVar5 = socket(iVar5,pCVar6->socktype,pCVar6->protocol);
    *sockfd = iVar5;
  }
  else {
    Curl_set_in_callback(data,true);
    cVar4 = (*(data->set).fopensocket)
                      ((data->set).opensocket_client,CURLSOCKTYPE_IPCXN,(curl_sockaddr *)pCVar8);
    *sockfd = cVar4;
    Curl_set_in_callback(data,false);
  }
  pcVar2 = local_c8;
  if (*sockfd == -1) {
    return CURLE_COULDNT_CONNECT;
  }
  if (local_c8->transport == '\x05') {
    curlx_nonblock(*sockfd,1);
    if (pCVar8->family == 10) {
      cVar4 = *sockfd;
      iVar3 = 0x29;
      iVar5 = 0x17;
    }
    else {
      if (pCVar8->family != 2) goto LAB_005c1f4a;
      cVar4 = *sockfd;
      iVar3 = 0;
      iVar5 = 10;
    }
    local_cc = 2;
    setsockopt(cVar4,iVar3,iVar5,&local_cc,4);
  }
LAB_005c1f4a:
  if ((pcVar2->scope_id != 0) && (pCVar8->family == 10)) {
    pCVar8 = &local_c0;
    if (addr != (Curl_sockaddr_ex *)0x0) {
      pCVar8 = addr;
    }
    *(uint *)((long)&pCVar8->_sa_ex_u + 0x18) = pcVar2->scope_id;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_socket(struct Curl_easy *data,
                     const struct Curl_addrinfo *ai,
                     struct Curl_sockaddr_ex *addr,
                     curl_socket_t *sockfd)
{
  struct connectdata *conn = data->conn;
  struct Curl_sockaddr_ex dummy;

  if(!addr)
    /* if the caller doesn't want info back, use a local temp copy */
    addr = &dummy;

  /*
   * The Curl_sockaddr_ex structure is basically libcurl's external API
   * curl_sockaddr structure with enough space available to directly hold
   * any protocol-specific address structures. The variable declared here
   * will be used to pass / receive data to/from the fopensocket callback
   * if this has been set, before that, it is initialized from parameters.
   */

  addr->family = ai->ai_family;
  switch(conn->transport) {
  case TRNSPRT_TCP:
    addr->socktype = SOCK_STREAM;
    addr->protocol = IPPROTO_TCP;
    break;
  case TRNSPRT_UNIX:
    addr->socktype = SOCK_STREAM;
    addr->protocol = IPPROTO_IP;
    break;
  default: /* UDP and QUIC */
    addr->socktype = SOCK_DGRAM;
    addr->protocol = IPPROTO_UDP;
    break;
  }
  addr->addrlen = ai->ai_addrlen;

  if(addr->addrlen > sizeof(struct Curl_sockaddr_storage))
     addr->addrlen = sizeof(struct Curl_sockaddr_storage);
  memcpy(&addr->sa_addr, ai->ai_addr, addr->addrlen);

  if(data->set.fopensocket) {
   /*
    * If the opensocket callback is set, all the destination address
    * information is passed to the callback. Depending on this information the
    * callback may opt to abort the connection, this is indicated returning
    * CURL_SOCKET_BAD; otherwise it will return a not-connected socket. When
    * the callback returns a valid socket the destination address information
    * might have been changed and this 'new' address will actually be used
    * here to connect.
    */
    Curl_set_in_callback(data, true);
    *sockfd = data->set.fopensocket(data->set.opensocket_client,
                                    CURLSOCKTYPE_IPCXN,
                                    (struct curl_sockaddr *)addr);
    Curl_set_in_callback(data, false);
  }
  else
    /* opensocket callback not set, so simply create the socket now */
    *sockfd = socket(addr->family, addr->socktype, addr->protocol);

  if(*sockfd == CURL_SOCKET_BAD)
    /* no socket, no connection */
    return CURLE_COULDNT_CONNECT;

  if(conn->transport == TRNSPRT_QUIC) {
    /* QUIC sockets need to be nonblocking */
    (void)curlx_nonblock(*sockfd, TRUE);
    switch(addr->family) {
#if defined(__linux__) && defined(IP_MTU_DISCOVER)
    case AF_INET: {
      int val = IP_PMTUDISC_DO;
      (void)setsockopt(*sockfd, IPPROTO_IP, IP_MTU_DISCOVER, &val,
                       sizeof(val));
      break;
    }
#endif
#if defined(__linux__) && defined(IPV6_MTU_DISCOVER)
    case AF_INET6: {
      int val = IPV6_PMTUDISC_DO;
      (void)setsockopt(*sockfd, IPPROTO_IPV6, IPV6_MTU_DISCOVER, &val,
                       sizeof(val));
      break;
    }
#endif
    }
  }

#if defined(ENABLE_IPV6) && defined(HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID)
  if(conn->scope_id && (addr->family == AF_INET6)) {
    struct sockaddr_in6 * const sa6 = (void *)&addr->sa_addr;
    sa6->sin6_scope_id = conn->scope_id;
  }
#endif

  return CURLE_OK;
}